

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

fourcc_t MATROSKA_MetaSeekID(matroska_seekpoint *MetaSeek)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_binary *Element;
  uint8_t *Buffer;
  uint8_t *IDdata;
  ebml_element *SeekID;
  matroska_seekpoint *MetaSeek_local;
  
  peVar1 = MATROSKA_getContextSeek();
  bVar2 = EBML_ElementIsType((ebml_element *)MetaSeek,peVar1);
  if (bVar2 != 0) {
    peVar1 = MATROSKA_getContextSeekID();
    Element = (ebml_binary *)EBML_MasterFindFirstElt(&MetaSeek->Base,peVar1,0,0,0);
    if (Element == (ebml_binary *)0x0) {
      MetaSeek_local._4_4_ = 0;
    }
    else {
      Buffer = EBML_BinaryGetData(Element);
      if (Buffer == (uint8_t *)0x0) {
        MetaSeek_local._4_4_ = 0;
      }
      else {
        MetaSeek_local._4_4_ = EBML_BufferToID(Buffer);
      }
    }
    return MetaSeek_local._4_4_;
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x194,"fourcc_t MATROSKA_MetaSeekID(const matroska_seekpoint *)");
}

Assistant:

fourcc_t MATROSKA_MetaSeekID(const matroska_seekpoint *MetaSeek)
{
    ebml_element *SeekID;
    const uint8_t *IDdata;
    assert(EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek()));
    SeekID = EBML_MasterFindChild((ebml_master*)MetaSeek, MATROSKA_getContextSeekID());
    if (!SeekID)
        return 0;
    IDdata = EBML_BinaryGetData((ebml_binary*)SeekID);
    if (IDdata == NULL)
        return 0;
    return EBML_BufferToID(IDdata);
}